

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isDeclarationModifier(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0x11c) {
    if ((iVar1 != 0x67) && (iVar1 != 0x7d)) {
      return false;
    }
  }
  else if ((iVar1 != 0x11c) && (iVar1 != 0x143)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isDeclarationModifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::ConstKeyword:
        case TokenKind::VarKeyword:
        case TokenKind::StaticKeyword:
        case TokenKind::AutomaticKeyword:
            return true;
        default:
            return false;
    }
}